

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_copy(roaring_bitmap_t *r)

{
  uint uVar1;
  _Bool _Var2;
  byte bVar3;
  roaring_array_t *dest;
  void **ppvVar4;
  uint uVar5;
  ulong uVar6;
  
  dest = (roaring_array_t *)(*global_memory_hook.malloc)(0x28);
  if (dest != (roaring_array_t *)0x0) {
    uVar1 = (r->high_low_container).size;
    dest->keys = (uint16_t *)0x0;
    dest->typecodes = (uint8_t *)0x0;
    dest->size = 0;
    dest->allocation_size = 0;
    dest->containers = (void **)0x0;
    dest->flags = '\0';
    uVar5 = 0x10000;
    if (uVar1 < 0x10000) {
      uVar5 = uVar1;
    }
    if (uVar1 != 0) {
      uVar6 = (ulong)uVar5;
      ppvVar4 = (void **)(*global_memory_hook.malloc)(uVar6 * 0xb);
      if (ppvVar4 == (void **)0x0) {
        (*global_memory_hook.free)(dest);
        return (roaring_bitmap_t *)0x0;
      }
      dest->containers = ppvVar4;
      dest->keys = (uint16_t *)(ppvVar4 + uVar6);
      dest->typecodes = (uint8_t *)((long)(ppvVar4 + uVar6) + uVar6 * 2);
      dest->allocation_size = uVar5;
    }
    _Var2 = ra_overwrite(&r->high_low_container,dest,(_Bool)((r->high_low_container).flags & 1));
    if (_Var2) {
      if (((r->high_low_container).flags & 1) == 0) {
        bVar3 = dest->flags & 0xfe;
      }
      else {
        bVar3 = dest->flags | 1;
      }
      dest->flags = bVar3;
      return (roaring_bitmap_t *)dest;
    }
    roaring_bitmap_free((roaring_bitmap_t *)dest);
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_copy(const roaring_bitmap_t *r) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    if (!ra_init_with_capacity(  // allocation of list of containers can fail
            &ans->high_low_container, r->high_low_container.size)) {
        roaring_free(ans);
        return NULL;
    }
    if (!ra_overwrite(  // memory allocation of individual containers may fail
            &r->high_low_container, &ans->high_low_container, is_cow(r))) {
        roaring_bitmap_free(ans);  // overwrite should leave in freeable state
        return NULL;
    }
    roaring_bitmap_set_copy_on_write(ans, is_cow(r));
    return ans;
}